

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TStokesAnalytic::uxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *flux)

{
  uint uVar1;
  Fad<double> *pFVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  Fad<double> x1;
  Fad<double> x2;
  Fad<double> x3;
  undefined1 local_2f0 [16];
  TPZVec<Fad<double>_> *local_2e0;
  TPZVec<Fad<double>_> *pTStack_2d8;
  TPZVec<Fad<double>_> *local_2d0;
  undefined1 local_2c8 [16];
  TPZVec<Fad<double>_> *pTStack_2b8;
  Fad<double> *pFStack_2b0;
  Fad<double> *local_2a8;
  undefined1 local_2a0 [24];
  TPZVec<Fad<double>_> *pTStack_288;
  undefined1 local_278 [16];
  TPZVec<Fad<double>_> *local_268;
  double *pdStack_260;
  TPZVec<Fad<double>_> *local_258;
  undefined1 local_250 [16];
  MEM_CPY<double> *local_240;
  double *local_238;
  undefined1 local_230 [24];
  TPZVec<Fad<double>_> *pTStack_218;
  TPZVec<Fad<double>_> local_208;
  TPZVec<Fad<double>_> *local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [24];
  FadExpr<FadFuncSin<Fad<double>_>_> *local_1c0;
  undefined1 local_1b0 [16];
  double *local_1a0;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_198;
  FadExpr<FadFuncSin<Fad<double>_>_> local_188;
  undefined8 uStack_160;
  Fad<double> local_150;
  FadExpr<FadFuncSin<Fad<double>_>_> local_130;
  undefined1 local_108 [24];
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *local_f0;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_e8;
  FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> local_e0;
  TPZVec<Fad<double>_> *local_d8;
  undefined8 uStack_d0;
  FadExpr<FadFuncCos<Fad<double>_>_> **local_c0;
  TPZVec<Fad<double>_> *local_b8;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  local_b0;
  Fad<double> *local_a0;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_98;
  FadExpr<FadFuncCos<Fad<double>_>_> ***local_90;
  Fad<double> **local_88;
  FadExpr<FadFuncCos<Fad<double>_>_> *local_80;
  TPZVec<Fad<double>_> *local_78;
  undefined8 local_70;
  FadExpr<FadFuncCos<Fad<double>_>_> ****local_68;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  local_60;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  local_50;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
  local_40;
  
  pFVar2 = x->fStore;
  local_250._0_8_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_240 = (MEM_CPY<double> *)0x0;
  local_250._8_4_ = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 << 3;
    }
    local_240 = (MEM_CPY<double> *)operator_new__(uVar9);
    MEM_CPY<double>::copy
              (local_240,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_238 = (double *)pFVar2->defaultVal;
  pFVar2 = x->fStore;
  local_208._vptr_TPZVec = (_func_int **)pFVar2[1].val_;
  uVar1 = pFVar2[1].dx_.num_elts;
  local_208.fNElements = 0;
  local_208.fStore._0_4_ = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 * 8;
    }
    local_208.fNElements = (int64_t)operator_new__(uVar9);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_208.fNElements,(EVP_PKEY_CTX *)pFVar2[1].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_208.fNAlloc = (int64_t)pFVar2[1].defaultVal;
  pFVar2 = x->fStore;
  local_150.val_ = pFVar2[2].val_;
  uVar1 = pFVar2[2].dx_.num_elts;
  local_150.dx_.ptr_to_data = (double *)0x0;
  local_150.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 * 8;
    }
    local_150.dx_.ptr_to_data = (double *)operator_new__(uVar9);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_150.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar2[2].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  uVar4 = local_250._8_4_;
  local_150.defaultVal = pFVar2[2].defaultVal;
  switch(this->fExactSol) {
  case EKovasznay:
  case EKovasznayCDG:
    dVar11 = 1.0 / this->fvisco;
    local_1e8 = (TPZVec<Fad<double>_> *)(dVar11 * 0.5);
    dVar11 = this->Pi * 4.0 * this->Pi + dVar11 * dVar11 * 0.25;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    local_268 = (TPZVec<Fad<double>_> *)((double)local_1e8 - dVar11);
    pdStack_260 = (double *)0x0;
    local_258 = (TPZVec<Fad<double>_> *)local_250;
    local_2e0 = (TPZVec<Fad<double>_> *)(this->Pi + this->Pi);
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    pFStack_2b0 = (Fad<double> *)local_2a0;
    local_2c8._8_8_ = (Fad<double> *)0x3ff0000000000000;
    pTStack_2b8 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0 = &local_208;
    local_2a0._0_8_ = (Fad<double> *)local_278;
    local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0;
    local_1e8 = local_268;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)local_2c8);
    local_2e0 = (TPZVec<Fad<double>_> *)(this->Pi + this->Pi);
    local_268 = local_1e8;
    local_2c8._8_8_ = (double)local_1e8 / (double)local_2e0;
    pdStack_260 = (double *)0x0;
    local_258 = (TPZVec<Fad<double>_> *)local_250;
    pTStack_2b8 = (TPZVec<Fad<double>_> *)0x0;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0 = &local_208;
    pFStack_2b0 = (Fad<double> *)local_278;
    local_2a0._0_8_ = (Fad<double> *)local_2c8;
    local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    break;
  case ESinCos:
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,(FadFuncSin<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)0xbff0000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pTStack_288 = (TPZVec<Fad<double>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0,(FadFuncSin<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_230._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    local_230._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_230);
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)0xbff0000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pTStack_288 = (TPZVec<Fad<double>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_230._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    local_230._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_230);
    goto LAB_01411344;
  case ENoFlow:
    pFVar2 = flux->fStore;
    uVar9 = (ulong)(uint)local_250._8_4_;
    uVar1 = (pFVar2->dx_).num_elts;
    if (local_250._8_4_ != uVar1) {
      if (local_250._8_4_ == 0) {
        if (uVar1 != 0) {
          pdVar7 = (pFVar2->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar2->dx_).num_elts = 0;
          (pFVar2->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar10 = (long)(int)local_250._8_4_;
        if (uVar1 != 0) {
          pdVar7 = (pFVar2->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar2->dx_).num_elts = 0;
          (pFVar2->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar2->dx_).num_elts = uVar4;
        uVar8 = 0xffffffffffffffff;
        if (-1 < (int)uVar4) {
          uVar8 = lVar10 << 3;
        }
        pdVar7 = (double *)operator_new__(uVar8);
        (pFVar2->dx_).ptr_to_data = pdVar7;
      }
    }
    uVar5 = local_250._8_4_;
    if (uVar4 != 0) {
      pdVar7 = (pFVar2->dx_).ptr_to_data;
      if (local_250._8_4_ == 0) {
        if (0 < (int)uVar4) {
          uVar8 = 0;
          do {
            pdVar7[uVar8] = (double)local_238 * 0.0;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          pdVar7[uVar8] = *(double *)(local_240 + uVar8 * 8) * 0.0;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    pFVar2->val_ = (double)local_250._0_8_ * 0.0;
    pFVar2 = flux->fStore;
    uVar9 = (ulong)(uint)local_250._8_4_;
    uVar1 = pFVar2[1].dx_.num_elts;
    if (local_250._8_4_ != uVar1) {
      if (local_250._8_4_ == 0) {
        if (uVar1 != 0) {
          pdVar7 = pFVar2[1].dx_.ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          pFVar2[1].dx_.num_elts = 0;
          pFVar2[1].dx_.ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar10 = (long)(int)local_250._8_4_;
        if (uVar1 != 0) {
          pdVar7 = pFVar2[1].dx_.ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          pFVar2[1].dx_.num_elts = 0;
          pFVar2[1].dx_.ptr_to_data = (double *)0x0;
        }
        pFVar2[1].dx_.num_elts = uVar5;
        uVar8 = 0xffffffffffffffff;
        if (-1 < (int)uVar5) {
          uVar8 = lVar10 << 3;
        }
        pdVar7 = (double *)operator_new__(uVar8);
        pFVar2[1].dx_.ptr_to_data = pdVar7;
      }
    }
    if (uVar5 != 0) {
      pdVar7 = pFVar2[1].dx_.ptr_to_data;
      if (local_250._8_4_ == 0) {
        if (0 < (int)uVar5) {
          uVar8 = 0;
          do {
            pdVar7[uVar8] = (double)local_238 * 0.0;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else if (0 < (int)uVar5) {
        uVar8 = 0;
        do {
          pdVar7[uVar8] = *(double *)(local_240 + uVar8 * 8) * 0.0;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    pFVar2[1].val_ = (double)local_250._0_8_ * 0.0;
    break;
  case ESinCos3D:
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,(FadFuncSin<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_230._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0,(FadFuncSin<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_2a0._0_8_ = local_230;
    local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_2a0);
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_188._0_8_ = (TPZVec<Fad<double>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_1b0._0_8_ = &local_188;
    local_1b0._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_230,&local_150);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_1d8._8_8_ = &local_130;
    local_1d8._0_8_ = local_1b0;
    local_130._0_8_ = (Fad<double> *)local_2c8;
    local_130.fadexpr_.expr_.val_ = (double)local_2a0;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)local_1d8);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_230._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_150);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_2a0._0_8_ = (Fad<double> *)local_230;
    local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_2a0);
    goto LAB_01411344;
  case EPconst:
    pFVar2 = flux->fStore;
    pFVar2->val_ = (double)local_250._0_8_;
    Vector<double>::operator=(&pFVar2->dx_,(Vector<double> *)(local_250 + 8));
    uVar6 = (uint)local_208.fStore;
    pFVar2->defaultVal = (double)local_238;
    pFVar2 = flux->fStore;
    uVar9 = (ulong)(uint)local_208.fStore;
    uVar1 = pFVar2[1].dx_.num_elts;
    if ((uint)local_208.fStore != uVar1) {
      if ((uint)local_208.fStore == 0) {
        if (uVar1 != 0) {
          pdVar7 = pFVar2[1].dx_.ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          pFVar2[1].dx_.num_elts = 0;
          pFVar2[1].dx_.ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar10 = (long)(int)(uint)local_208.fStore;
        if (uVar1 != 0) {
          pdVar7 = pFVar2[1].dx_.ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          pFVar2[1].dx_.num_elts = 0;
          pFVar2[1].dx_.ptr_to_data = (double *)0x0;
        }
        pFVar2[1].dx_.num_elts = uVar6;
        uVar8 = 0xffffffffffffffff;
        if (-1 < (int)uVar6) {
          uVar8 = lVar10 << 3;
        }
        pdVar7 = (double *)operator_new__(uVar8);
        pFVar2[1].dx_.ptr_to_data = pdVar7;
      }
    }
    if (uVar6 != 0) {
      pdVar7 = pFVar2[1].dx_.ptr_to_data;
      if ((uint)local_208.fStore == 0) {
        if (0 < (int)uVar6) {
          uVar8 = 0;
          do {
            pdVar7[uVar8] = -(double)local_208.fNAlloc;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
      else if (0 < (int)uVar6) {
        uVar8 = 0;
        do {
          pdVar7[uVar8] = -*(double *)(local_208.fNElements + uVar8 * 8);
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    pFVar2[1].val_ = -(double)local_208._vptr_TPZVec;
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x8c0);
  case ESinCosBDS:
    local_1e8 = (TPZVec<Fad<double>_> *)::exp(this->fcBrinkman / this->fvisco);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,(FadFuncSin<Fad<double>_> *)local_2f0
              );
    local_188.fadexpr_.expr_.defaultVal = 1.0 / (double)local_1e8;
    uStack_160 = 0;
    local_1e8 = (TPZVec<Fad<double>_> *)-local_188.fadexpr_.expr_.defaultVal;
    uStack_1e0 = 0x8000000000000000;
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_1d8._8_8_ = local_1e8;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0,(FadFuncSin<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_188._0_8_ = (TPZVec<Fad<double>_> *)local_1d8;
    local_188.fadexpr_.expr_.val_ = (double)local_2f0;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    local_188.fadexpr_.expr_.defaultVal = 1.0 - local_188.fadexpr_.expr_.defaultVal;
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_188.fadexpr_.expr_.defaultVal;
    local_1a0 = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_230,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_130._0_8_ = (Fad<double> *)&local_188;
    local_130.fadexpr_.expr_.val_ = (double)local_108;
    local_108._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)local_1b0;
    local_108._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_1d8._8_8_ = local_1e8;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_188._0_8_ = (TPZVec<Fad<double>_> *)local_1d8;
    local_188.fadexpr_.expr_.val_ = (double)local_2f0;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2a0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_188.fadexpr_.expr_.defaultVal;
    local_1a0 = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_230,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0,(FadFuncCos<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_130._0_8_ = (Fad<double> *)&local_188;
    local_130.fadexpr_.expr_.val_ = (double)local_108;
    local_108._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)local_1b0;
    local_108._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    goto LAB_014111c3;
  case ESinCosBDS3D:
    local_1e8 = (TPZVec<Fad<double>_> *)::exp(this->fcBrinkman / this->fvisco);
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_278,(FadFuncSin<Fad<double>_> *)local_2f0
              );
    local_188.fadexpr_.expr_.defaultVal = 1.0 / (double)local_1e8;
    uStack_160 = 0;
    local_d8 = (TPZVec<Fad<double>_> *)-local_188.fadexpr_.expr_.defaultVal;
    uStack_d0 = 0x8000000000000000;
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_1d8._8_8_ = local_d8;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0,(FadFuncSin<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_188._0_8_ = local_1d8;
    local_188.fadexpr_.expr_.val_ = (double)local_2f0;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    local_1e8 = (TPZVec<Fad<double>_> *)(1.0 - local_188.fadexpr_.expr_.defaultVal);
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._8_8_ = local_1e8;
    local_1a0 = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_230,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_108._0_8_ = local_1b0;
    local_130.fadexpr_.expr_.val_ = (double)local_108;
    local_130._0_8_ = &local_188;
    local_108._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)&local_130);
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_e0.fadexpr_.expr_ =
         (FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>)
         (FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_b0.fadexpr_.left_ = &local_e0;
    local_b0.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_230,&local_150);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0,(FadFuncSin<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_50.fadexpr_.right_ = &local_60;
    local_50.fadexpr_.left_ = &local_b0;
    local_f0 = &local_50;
    local_108._8_8_ = local_188.fadexpr_.expr_.defaultVal;
    local_108._16_8_ = (double *)0x0;
    local_60.fadexpr_.left_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8;
    local_60.fadexpr_.right_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2a0;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_1d8,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_230,(FadFuncCos<Fad<double>_> *)local_1d8
              );
    Fad<double>::~Fad((Fad<double> *)local_1d8);
    local_e8 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_230;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_1b0,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8,(FadFuncCos<Fad<double>_> *)local_1b0
              );
    Fad<double>::~Fad((Fad<double> *)local_1b0);
    local_c0 = &local_e8;
    local_b8 = (TPZVec<Fad<double>_> *)local_1d8;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)&local_130,(Fad<double> *)&local_208);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_1b0,
               (FadFuncSin<Fad<double>_> *)&local_130);
    Fad<double>::~Fad((Fad<double> *)&local_130);
    FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)&local_188,&local_150);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr(&local_130,(FadFuncSin<Fad<double>_> *)&local_188);
    Fad<double>::~Fad((Fad<double> *)&local_188);
    local_88 = &local_a0;
    local_90 = &local_c0;
    local_68 = &local_90;
    local_78 = local_1e8;
    local_70 = 0;
    local_40.fadexpr_.left_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)local_108;
    local_a0 = (Fad<double> *)local_1b0;
    local_98 = &local_130;
    local_40.fadexpr_.right_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)&local_80;
    Fad<double>::operator=(flux->fStore + 1,&local_40);
    Fad<double>::~Fad(&local_130.fadexpr_.expr_);
    Fad<double>::~Fad((Fad<double> *)(local_1b0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_1d8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_230 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2f0,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_278,(FadFuncCos<Fad<double>_> *)local_2f0
              );
    Fad<double>::~Fad((Fad<double> *)local_2f0);
    local_1d8._8_8_ = local_d8;
    local_1d8._16_8_ = (double *)0x0;
    local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_278;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_2c8,&local_150);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,(FadFuncCos<Fad<double>_> *)local_2c8
              );
    Fad<double>::~Fad((Fad<double> *)local_2c8);
    local_188._0_8_ = (TPZVec<Fad<double>_> *)local_1d8;
    local_188.fadexpr_.expr_.val_ = (double)local_2f0;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2a0,(Fad<double> *)&local_208);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_80 = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8;
    FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_230,&local_150);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0,(FadFuncCos<Fad<double>_> *)local_230
              );
    Fad<double>::~Fad((Fad<double> *)local_230);
    local_1b0._8_8_ = local_1e8;
    local_1a0 = (double *)0x0;
    local_198 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_108;
    local_130._0_8_ = (Fad<double> *)&local_188;
    local_130.fadexpr_.expr_.val_ = (double)local_1b0;
    local_108._0_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
          *)&local_80;
    local_108._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2a0;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
                *)&local_130);
LAB_014111c3:
    Fad<double>::~Fad((Fad<double> *)(local_2a0 + 8));
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
LAB_01411344:
    Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
    puVar3 = local_278;
LAB_01411356:
    Fad<double>::~Fad((Fad<double> *)(puVar3 + 8));
    break;
  case EGatica3D:
    local_2e0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (TPZVec<Fad<double>_> *)local_250;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0 = &local_208;
    pFStack_2b0 = (Fad<double> *)0x0;
    local_2a8 = &local_150;
    pTStack_2b8 = local_2e0;
    local_2a0._0_8_ = (Fad<double> *)local_230;
    local_2a0._8_8_ = (TPZVec<Fad<double>_> *)local_2c8;
    local_268 = local_2e0;
    local_230._0_8_ =
         (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_278;
    local_230._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    local_2e0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (TPZVec<Fad<double>_> *)local_250;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0 = &local_208;
    pFStack_2b0 = (Fad<double> *)0x0;
    local_2a8 = &local_150;
    pTStack_2b8 = local_2e0;
    local_2a0._0_8_ = (Fad<double> *)local_230;
    local_2a0._8_8_ = (TPZVec<Fad<double>_> *)local_2c8;
    local_268 = local_2e0;
    local_230._0_8_ =
         (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)local_278;
    local_230._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_2a0);
    local_2e0 = (TPZVec<Fad<double>_> *)this->Pi;
    pdStack_260 = (double *)0x0;
    local_258 = (TPZVec<Fad<double>_> *)local_250;
    local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)0xc000000000000000;
    local_2a0._16_8_ = (double *)0x0;
    pTStack_288 = (TPZVec<Fad<double>_> *)local_278;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_2d0 = &local_208;
    local_230._0_8_ = local_1d8;
    pFStack_2b0 = (Fad<double> *)0x0;
    local_2a8 = &local_150;
    pTStack_2b8 = local_2e0;
    local_268 = local_2e0;
    local_230._8_8_ = (TPZVec<Fad<double>_> *)local_2c8;
    local_1d8._0_8_ = (Fad<double> *)local_2a0;
    local_1d8._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
    Fad<double>::operator=
              (flux->fStore + 2,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)local_230);
    break;
  case ECouplingSD:
    if ((double)local_208._vptr_TPZVec < 0.0) {
      local_1d8._8_8_ = &local_208;
      FadFuncExp<Fad<double>_>::FadFuncExp
                ((FadFuncExp<Fad<double>_> *)local_2f0,(Fad<double> *)&local_208);
      FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_278,
                 (FadFuncExp<Fad<double>_> *)local_2f0);
      Fad<double>::~Fad((Fad<double> *)local_2f0);
      local_230._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8;
      local_230._8_8_ = (FadExpr<FadFuncExp<Fad<double>_>_> *)local_278;
      FadFuncCos<Fad<double>_>::FadFuncCos
                ((FadFuncCos<Fad<double>_> *)local_2c8,(Fad<double> *)local_250);
      FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0,
                 (FadFuncCos<Fad<double>_> *)local_2c8);
      Fad<double>::~Fad((Fad<double> *)local_2c8);
      local_2a0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_230;
      local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_2f0;
      Fad<double>::operator=
                (flux->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                  *)local_2a0);
      Fad<double>::~Fad((Fad<double> *)(local_2f0 + 8));
      Fad<double>::~Fad((Fad<double> *)(local_278 + 8));
      local_1d8._8_8_ = &local_208;
      FadFuncExp<Fad<double>_>::FadFuncExp
                ((FadFuncExp<Fad<double>_> *)local_2f0,(Fad<double> *)&local_208);
      FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_278,
                 (FadFuncExp<Fad<double>_> *)local_2f0);
      Fad<double>::~Fad((Fad<double> *)local_2f0);
      local_230._0_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_1d8;
      local_230._8_8_ = (TPZVec<Fad<double>_> *)local_278;
      local_1b0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_230;
      FadFuncSin<Fad<double>_>::FadFuncSin
                ((FadFuncSin<Fad<double>_> *)local_2c8,(Fad<double> *)local_250);
      FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0,
                 (FadFuncSin<Fad<double>_> *)local_2c8);
      Fad<double>::~Fad((Fad<double> *)local_2c8);
      local_2a0._0_8_ = local_1b0;
      local_2a0._8_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_2f0;
      Fad<double>::operator=
                (flux->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                  *)local_2a0);
      goto LAB_01411344;
    }
    if ((double)local_208._vptr_TPZVec < 0.0) break;
    local_2e0 = (TPZVec<Fad<double>_> *)this->Pi;
    local_230._8_8_ = 2.0 / (double)local_2e0;
    pdStack_260 = (double *)0x0;
    local_2d0 = &local_208;
    local_230._16_8_ = (double *)0x0;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_268 = local_2e0;
    local_258 = local_2d0;
    pTStack_218 = (TPZVec<Fad<double>_> *)local_278;
    local_1b0._0_8_ = (Fad<double> *)local_230;
    local_1b0._8_8_ = (Fad<double> *)local_2f0;
    FadFuncCos<Fad<double>_>::FadFuncCos
              ((FadFuncCos<Fad<double>_> *)local_2a0,(Fad<double> *)local_250);
    FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_2c8,(FadFuncCos<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1d8._0_8_ = local_1b0;
    local_1d8._8_8_ = (Fad<double> *)local_2c8;
    Fad<double>::operator=
              (flux->fStore,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)local_1d8);
    Fad<double>::~Fad((Fad<double> *)(local_2c8 + 8));
    local_2e0 = (TPZVec<Fad<double>_> *)this->Pi;
    local_230._8_8_ = 1.0 / ((double)local_2e0 * (double)local_2e0);
    pdStack_260 = (double *)0x0;
    local_2d0 = &local_208;
    local_230._16_8_ = (double *)0x0;
    pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
    local_1d8._0_8_ = &local_130;
    local_1d8._8_8_ = (TPZVec<Fad<double>_> *)0x4000000000000000;
    local_1d8._16_8_ = (double *)0x0;
    local_268 = local_2e0;
    local_258 = local_2d0;
    pTStack_218 = (TPZVec<Fad<double>_> *)local_278;
    local_130._0_8_ = (Fad<double> *)local_230;
    local_130.fadexpr_.expr_.val_ = (double)local_2f0;
    FadFuncSin<Fad<double>_>::FadFuncSin
              ((FadFuncSin<Fad<double>_> *)local_2a0,(Fad<double> *)local_250);
    FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_2c8,(FadFuncSin<Fad<double>_> *)local_2a0
              );
    Fad<double>::~Fad((Fad<double> *)local_2a0);
    local_1b0._0_8_ = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_1d8;
    local_1b0._8_8_ = (TPZVec<Fad<double>_> *)local_2c8;
    Fad<double>::operator=
              (flux->fStore + 1,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)local_1b0);
    puVar3 = local_2c8;
    goto LAB_01411356;
  case ECouplingNSD:
    if (1.0 <= (double)local_208._vptr_TPZVec) {
      if (1.0 <= (double)local_208._vptr_TPZVec) {
        local_2f0._8_8_ = this->Pi;
        local_2e0 = (TPZVec<Fad<double>_> *)0x0;
        pTStack_2d8 = &local_208;
        local_130._0_8_ = local_278;
        local_268 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pdStack_260 = (double *)0x0;
        local_2a0._16_8_ = (double *)0x0;
        pTStack_2b8 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pFStack_2b0 = (Fad<double> *)0x0;
        local_1b0._0_8_ = &local_130;
        local_1d8._16_8_ = (double *)0x0;
        local_1c0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_250;
        local_230._16_8_ = (double *)0x4000000000000000;
        pTStack_218 = (TPZVec<Fad<double>_> *)0x0;
        local_2c8._8_8_ = (Fad<double> *)local_2a0;
        local_2a0._8_8_ = local_2f0._8_8_;
        pTStack_288 = pTStack_2d8;
        local_278._8_8_ = (TPZVec<Fad<double>_> *)local_2f0;
        local_230._8_8_ = (Fad<double> *)local_1d8;
        local_1e8 = flux;
        local_1d8._8_8_ = local_2f0._8_8_;
        local_1b0._8_8_ = (Fad<double> *)local_230;
        local_130.fadexpr_.expr_.val_ = (double)local_2c8;
        Fad<double>::operator=
                  (flux->fStore,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)local_1b0);
        local_2c8._8_8_ = this->Pi;
        pTStack_2b8 = (TPZVec<Fad<double>_> *)0x0;
        pFStack_2b0 = (Fad<double> *)local_250;
        local_2e0 = (TPZVec<Fad<double>_> *)0x4000000000000000;
        pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
        local_1b0._0_8_ = &local_188;
        pdStack_260 = (double *)0x0;
        local_258 = &local_208;
        local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)0x3fd0000000000000;
        local_2a0._16_8_ = (double *)0x0;
        pTStack_288 = (TPZVec<Fad<double>_> *)local_278;
        local_230._16_8_ = (double *)0x0;
        local_1d8._8_8_ = (TPZVec<Fad<double>_> *)0x4010000000000000;
        local_1d8._16_8_ = (double *)0x0;
        local_1b0._8_8_ = &local_130;
        local_2f0._8_8_ = (Fad<double> *)local_2c8;
        local_268 = (TPZVec<Fad<double>_> *)local_2c8._8_8_;
        local_230._8_8_ = local_2c8._8_8_;
        pTStack_218 = local_258;
        local_1d8._0_8_ = (Fad<double> *)local_230;
        local_188._0_8_ = (TPZVec<Fad<double>_> *)local_2f0;
        local_130._0_8_ = (Fad<double> *)local_2a0;
        local_130.fadexpr_.expr_.val_ = (double)local_1d8;
        Fad<double>::operator=
                  ((Fad<double> *)
                   ((long)(((FadFuncCos<Fad<double>_> *)&local_1e8->fStore)->expr_).val_ + 0x20),
                   (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)local_1b0);
      }
    }
    else {
      local_2a0._8_8_ = this->Pi;
      local_2f0._8_8_ = (double)local_2a0._8_8_ * -0.125 * (double)local_2a0._8_8_;
      local_1d8._0_8_ = local_2f0;
      local_2e0 = (TPZVec<Fad<double>_> *)0x0;
      local_2a0._16_8_ = (double *)0x0;
      pTStack_288 = (TPZVec<Fad<double>_> *)local_250;
      local_1d8._8_8_ = local_2c8;
      pTStack_2b8 = (TPZVec<Fad<double>_> *)0x4000000000000000;
      pFStack_2b0 = (Fad<double> *)0x0;
      local_230._0_8_ = local_1d8;
      local_268 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pdStack_260 = (double *)0x0;
      pTStack_2d8 = &local_208;
      local_2c8._8_8_ = (Fad<double> *)local_2a0;
      local_258 = &local_208;
      local_230._8_8_ = (Fad<double> *)local_278;
      Fad<double>::operator=
                (flux->fStore,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)local_230);
      local_230._8_8_ = this->Pi;
      local_2c8._8_8_ = (double)local_230._8_8_ * 0.25;
      local_230._16_8_ = (double *)0x0;
      pTStack_218 = (TPZVec<Fad<double>_> *)local_250;
      local_2a0._16_8_ = (double *)0x4000000000000000;
      pTStack_288 = (TPZVec<Fad<double>_> *)0x0;
      pTStack_2b8 = (TPZVec<Fad<double>_> *)0x0;
      local_130._0_8_ = &local_188;
      local_268 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pdStack_260 = (double *)0x0;
      local_1b0._0_8_ = &local_130;
      local_2e0 = (TPZVec<Fad<double>_> *)0x3ff0000000000000;
      pTStack_2d8 = (TPZVec<Fad<double>_> *)0x0;
      local_1d8._8_8_ = local_1b0;
      local_1b0._8_8_ = local_2f0;
      local_1d8._0_8_ = local_2c8;
      local_2d0 = &local_208;
      pFStack_2b0 = (Fad<double> *)local_2a0;
      local_2a0._8_8_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_230;
      local_258 = &local_208;
      local_188._0_8_ = &local_208;
      local_130.fadexpr_.expr_.val_ = (double)local_278;
      Fad<double>::operator=
                (flux->fStore + 1,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)local_1d8);
    }
  }
  Fad<double>::~Fad(&local_150);
  Fad<double>::~Fad((Fad<double> *)&local_208);
  Fad<double>::~Fad((Fad<double> *)local_250);
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}